

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btPoint2PointConstraint.cpp
# Opt level: O2

void __thiscall
btPoint2PointConstraint::btPoint2PointConstraint
          (btPoint2PointConstraint *this,btRigidBody *rbA,btVector3 *pivotInA)

{
  undefined8 uVar1;
  btVector3 bVar2;
  
  btTypedConstraint::btTypedConstraint
            (&this->super_btTypedConstraint,POINT2POINT_CONSTRAINT_TYPE,rbA);
  (this->super_btTypedConstraint)._vptr_btTypedConstraint =
       (_func_int **)&PTR__btTypedConstraint_001f1490;
  uVar1 = *(undefined8 *)(pivotInA->m_floats + 2);
  *(undefined8 *)(this->m_pivotInA).m_floats = *(undefined8 *)pivotInA->m_floats;
  *(undefined8 *)((this->m_pivotInA).m_floats + 2) = uVar1;
  bVar2 = btTransform::operator()(&(rbA->super_btCollisionObject).m_worldTransform,pivotInA);
  *&(this->m_pivotInB).m_floats = bVar2.m_floats;
  this->m_flags = 0;
  this->m_useSolveConstraintObsolete = false;
  (this->m_setting).m_tau = 0.3;
  (this->m_setting).m_damping = 1.0;
  (this->m_setting).m_impulseClamp = 0.0;
  return;
}

Assistant:

btPoint2PointConstraint::btPoint2PointConstraint(btRigidBody& rbA,const btVector3& pivotInA)
:btTypedConstraint(POINT2POINT_CONSTRAINT_TYPE,rbA),m_pivotInA(pivotInA),m_pivotInB(rbA.getCenterOfMassTransform()(pivotInA)),
m_flags(0),
m_useSolveConstraintObsolete(false)
{
	
}